

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.h
# Opt level: O0

void strbuf_append_mem(strbuf_t *s,char *c,int len)

{
  int len_local;
  char *c_local;
  strbuf_t *s_local;
  
  strbuf_ensure_empty_length(s,len);
  memcpy(s->buf + s->length,c,(long)len);
  s->length = len + s->length;
  return;
}

Assistant:

static inline void strbuf_append_mem(strbuf_t *s, const char *c, int len)
{
    strbuf_ensure_empty_length(s, len);
    memcpy(s->buf + s->length, c, len);
    s->length += len;
}